

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfFormatter<wchar_t>::parse_flags
          (PrintfFormatter<wchar_t> *this,FormatSpec *spec,wchar_t **s)

{
  wchar_t *pwVar1;
  wchar_t **s_local;
  FormatSpec *spec_local;
  PrintfFormatter<wchar_t> *this_local;
  
  do {
    pwVar1 = *s;
    *s = pwVar1 + 1;
    switch(*pwVar1) {
    case L' ':
      spec->flags_ = spec->flags_ | 1;
      break;
    default:
      *s = *s + -1;
      return;
    case L'#':
      spec->flags_ = spec->flags_ | 8;
      break;
    case L'+':
      spec->flags_ = spec->flags_ | 3;
      break;
    case L'-':
      (spec->super_AlignSpec).align_ = ALIGN_LEFT;
      break;
    case L'0':
      (spec->super_AlignSpec).super_WidthSpec.fill_ = L'0';
    }
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::parse_flags(
    FormatSpec &spec, const Char *&s) {
  for (;;) {
    switch (*s++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags_ |= SIGN_FLAG;
        break;
      case '#':
        spec.flags_ |= HASH_FLAG;
        break;
      default:
        --s;
        return;
    }
  }
}